

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *allocator,void *address,uint pageCount,uint committedCount,bool enableWriteBarrier)

{
  bool enableWriteBarrier_local;
  uint committedCount_local;
  uint pageCount_local;
  void *address_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *allocator_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  SegmentBase<Memory::VirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  BVStatic<272UL>::BVStatic(&this->freePages);
  BVStatic<272UL>::BVStatic(&this->decommitPages);
  this->freePageCount = 0;
  this->decommitPageCount = 0;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).field_0x2c =
       (this->super_SegmentBase<Memory::VirtualAllocWrapper>).field_0x2c & 0xfb | 4;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address = (char *)address;
  (this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount = (ulong)pageCount;
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, void* address, uint pageCount, uint committedCount, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0), freePageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    this->address = (char*)address;
    this->segmentPageCount = pageCount;
}